

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PP_el_hahn.cpp
# Opt level: O0

void __thiscall
PP_el_hahn::multiChromeDiffusion
          (PP_el_hahn *this,double mx0,double my0,double mz0,int N,bool rotFrame)

{
  double *pdVar1;
  double dVar2;
  double local_708;
  allocator<char> local_6f1;
  string local_6f0;
  allocator<char> local_6c9;
  string local_6c8;
  allocator<char> local_6a1;
  string local_6a0;
  allocator<char> local_679;
  string local_678;
  allocator<char> local_651;
  string local_650;
  double local_630;
  C_matrix<double> local_628;
  C_matrix<double> local_600;
  double local_5d8;
  C_matrix<double> local_5d0;
  C_matrix<double> local_5a8;
  double local_580;
  C_matrix<double> local_578;
  C_matrix<double> local_550;
  double local_528;
  C_matrix<double> local_520;
  C_matrix<double> local_4f8;
  double local_4d0;
  C_matrix<double> local_4c8;
  C_matrix<double> local_4a0;
  C_matrix<double> local_478;
  C_matrix<double> local_450;
  C_matrix<double> local_428;
  C_matrix<double> local_400;
  C_matrix<double> local_3d8;
  C_matrix<double> local_3b0;
  C_matrix<double> local_388;
  C_matrix<double> local_360;
  C_matrix<double> local_338;
  C_matrix<double> local_310;
  int local_2e8;
  allocator<char> local_2e1;
  int n;
  C_matrix<double> local_2c0;
  allocator<char> local_291;
  string local_290;
  C_matrix<double> local_270;
  allocator<char> local_241;
  string local_240;
  C_matrix<double> local_220;
  allocator<char> local_1f1;
  string local_1f0;
  C_matrix<double> local_1d0;
  allocator<char> local_1a1;
  string local_1a0;
  C_matrix<double> local_180;
  double local_158;
  double t00;
  double t0;
  double tmpZ;
  double tmpY;
  double tmpX;
  double dw;
  double tempMuz0;
  double tmpBxy;
  double tmpBz0;
  double dt;
  C_matrix<double> MUsecondFID1;
  C_matrix<double> MUsecondPulse1;
  C_matrix<double> MUfirstFID1;
  undefined1 local_80 [8];
  C_matrix<double> MUfisrtPulse1;
  C_matrix<double> MUsteady1;
  bool rotFrame_local;
  int N_local;
  double mz0_local;
  double my0_local;
  double mx0_local;
  PP_el_hahn *this_local;
  
  C_matrix<double>::C_matrix((C_matrix<double> *)&MUfisrtPulse1.m_A);
  C_matrix<double>::C_matrix((C_matrix<double> *)local_80);
  C_matrix<double>::C_matrix((C_matrix<double> *)&MUsecondPulse1.m_A);
  C_matrix<double>::C_matrix((C_matrix<double> *)&MUsecondFID1.m_A);
  C_matrix<double>::C_matrix((C_matrix<double> *)&dt);
  tmpBxy = (this->super_PP_sigRMN).Bz0;
  tempMuz0 = (this->super_PP_sigRMN).Bxy;
  dw = (this->super_PP_sigRMN).muz0;
  tmpX = 0.0;
  (this->super_PP_sigRMN).muz0 = dw * (0.0 / ((this->super_PP_sigRMN).gamma * tmpBxy) + 1.0);
  (this->super_PP_sigRMN).Bz0 = tmpBxy + 0.0 / (this->super_PP_sigRMN).gamma;
  (this->super_PP_sigRMN).Bxy = 0.0;
  (this->super_PP_sigRMN).omega = 0.0;
  dVar2 = (this->super_PP_sigRMN).T1;
  pdVar1 = &(this->super_PP_sigRMN).T2;
  if (dVar2 < *pdVar1 || dVar2 == *pdVar1) {
    local_708 = (this->super_PP_sigRMN).T2;
  }
  else {
    local_708 = (this->super_PP_sigRMN).T1;
  }
  t00 = local_708;
  (this->super_PP_sigRMN).sigLength = 200;
  tmpBz0 = local_708 / (double)(this->super_PP_sigRMN).sigLength;
  local_158 = 0.0;
  t0 = mz0;
  tmpZ = my0;
  tmpY = mx0;
  dVar2 = PP_sigRMN::generateFIDsignalWithDiffusion(&this->super_PP_sigRMN,mx0,my0,mz0,tmpBz0,0.0);
  local_158 = local_158 + dVar2;
  pdVar1 = C_matrix<double>::operator()
                     (&(this->super_PP_sigRMN).MU,(this->super_PP_sigRMN).MU.endL,0);
  tmpY = *pdVar1;
  pdVar1 = C_matrix<double>::operator()
                     (&(this->super_PP_sigRMN).MU,(this->super_PP_sigRMN).MU.endL,1);
  tmpZ = *pdVar1;
  pdVar1 = C_matrix<double>::operator()
                     (&(this->super_PP_sigRMN).MU,(this->super_PP_sigRMN).MU.endL,2);
  t0 = *pdVar1;
  if (!rotFrame) {
    PP_sigRMN::frameToFix(&this->super_PP_sigRMN,local_158);
  }
  C_matrix<double>::operator=
            (&local_180,(C_matrix<double> *)&MUfisrtPulse1.m_A,&(this->super_PP_sigRMN).MU);
  C_matrix<double>::~C_matrix(&local_180);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,"initSigTime.txt",&local_1a1);
  C_matrix<double>::save(&(this->super_PP_sigRMN).T,&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  (this->super_PP_sigRMN).Bz0 = tmpBxy + tmpX / (this->super_PP_sigRMN).gamma;
  (this->super_PP_sigRMN).Bxy = tempMuz0;
  (this->super_PP_sigRMN).omega = (this->super_PP_sigRMN).gamma * (this->super_PP_sigRMN).Bz0;
  (this->super_PP_sigRMN).sigLength = 4000;
  tmpBz0 = (this->super_PP_sigRMN).tw / (double)(this->super_PP_sigRMN).sigLength;
  dVar2 = PP_sigRMN::generateRMNsignal(&this->super_PP_sigRMN,tmpY,tmpZ,t0,tmpBz0,tmpX);
  local_158 = local_158 + dVar2;
  pdVar1 = C_matrix<double>::operator()
                     (&(this->super_PP_sigRMN).MU,(this->super_PP_sigRMN).MU.endL,0);
  tmpY = *pdVar1;
  pdVar1 = C_matrix<double>::operator()
                     (&(this->super_PP_sigRMN).MU,(this->super_PP_sigRMN).MU.endL,1);
  tmpZ = *pdVar1;
  pdVar1 = C_matrix<double>::operator()
                     (&(this->super_PP_sigRMN).MU,(this->super_PP_sigRMN).MU.endL,2);
  t0 = *pdVar1;
  if (!rotFrame) {
    PP_sigRMN::frameToFix(&this->super_PP_sigRMN,local_158);
  }
  C_matrix<double>::operator=(&local_1d0,(C_matrix<double> *)local_80,&(this->super_PP_sigRMN).MU);
  C_matrix<double>::~C_matrix(&local_1d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"p90Time.txt",&local_1f1);
  C_matrix<double>::save(&(this->super_PP_sigRMN).T,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  (this->super_PP_sigRMN).Bz0 = tmpBxy + tmpX / (this->super_PP_sigRMN).gamma;
  (this->super_PP_sigRMN).Bxy = 0.0;
  (this->super_PP_sigRMN).omega = 0.0;
  (this->super_PP_sigRMN).sigLength = 4000;
  tmpBz0 = ((this->super_PP_sigRMN).TE * 0.5 - (this->super_PP_sigRMN).tw) /
           (double)(this->super_PP_sigRMN).sigLength;
  dVar2 = PP_sigRMN::generateFIDsignalWithDiffusion(&this->super_PP_sigRMN,tmpY,tmpZ,t0,tmpBz0,tmpX)
  ;
  local_158 = local_158 + dVar2;
  pdVar1 = C_matrix<double>::operator()
                     (&(this->super_PP_sigRMN).MU,(this->super_PP_sigRMN).MU.endL,0);
  tmpY = *pdVar1;
  pdVar1 = C_matrix<double>::operator()
                     (&(this->super_PP_sigRMN).MU,(this->super_PP_sigRMN).MU.endL,1);
  tmpZ = *pdVar1;
  pdVar1 = C_matrix<double>::operator()
                     (&(this->super_PP_sigRMN).MU,(this->super_PP_sigRMN).MU.endL,2);
  t0 = *pdVar1;
  if (!rotFrame) {
    PP_sigRMN::frameToFix(&this->super_PP_sigRMN,local_158);
  }
  C_matrix<double>::operator=
            (&local_220,(C_matrix<double> *)&MUsecondPulse1.m_A,&(this->super_PP_sigRMN).MU);
  C_matrix<double>::~C_matrix(&local_220);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"fidTime.txt",&local_241);
  C_matrix<double>::save(&(this->super_PP_sigRMN).T,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator(&local_241);
  (this->super_PP_sigRMN).Bz0 = tmpBxy + tmpX / (this->super_PP_sigRMN).gamma;
  (this->super_PP_sigRMN).Bxy = tempMuz0;
  (this->super_PP_sigRMN).omega = (this->super_PP_sigRMN).gamma * (this->super_PP_sigRMN).Bz0;
  (this->super_PP_sigRMN).sigLength = 4000;
  tmpBz0 = (this->super_PP_sigRMN).tw / (double)(this->super_PP_sigRMN).sigLength;
  dVar2 = PP_sigRMN::generateRMNsignal(&this->super_PP_sigRMN,tmpY,tmpZ,t0,tmpBz0,tmpX);
  local_158 = local_158 + dVar2;
  pdVar1 = C_matrix<double>::operator()
                     (&(this->super_PP_sigRMN).MU,(this->super_PP_sigRMN).MU.endL,0);
  tmpY = *pdVar1;
  pdVar1 = C_matrix<double>::operator()
                     (&(this->super_PP_sigRMN).MU,(this->super_PP_sigRMN).MU.endL,1);
  tmpZ = *pdVar1;
  pdVar1 = C_matrix<double>::operator()
                     (&(this->super_PP_sigRMN).MU,(this->super_PP_sigRMN).MU.endL,2);
  t0 = *pdVar1;
  if (!rotFrame) {
    PP_sigRMN::frameToFix(&this->super_PP_sigRMN,local_158);
  }
  C_matrix<double>::operator=
            (&local_270,(C_matrix<double> *)&MUsecondFID1.m_A,&(this->super_PP_sigRMN).MU);
  C_matrix<double>::~C_matrix(&local_270);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"p180Time.txt",&local_291)
  ;
  C_matrix<double>::save(&(this->super_PP_sigRMN).T,&local_290);
  std::__cxx11::string::~string((string *)&local_290);
  std::allocator<char>::~allocator(&local_291);
  (this->super_PP_sigRMN).Bz0 = tmpBxy + tmpX / (this->super_PP_sigRMN).gamma;
  (this->super_PP_sigRMN).Bxy = 0.0;
  (this->super_PP_sigRMN).omega = 0.0;
  (this->super_PP_sigRMN).sigLength = 4000;
  tmpBz0 = (((this->super_PP_sigRMN).TE - (this->super_PP_sigRMN).tw) * 1.5) /
           (double)(this->super_PP_sigRMN).sigLength;
  dVar2 = PP_sigRMN::generateFIDsignalWithDiffusion(&this->super_PP_sigRMN,tmpY,tmpZ,t0,tmpBz0,tmpX)
  ;
  local_158 = dVar2 + local_158;
  if (!rotFrame) {
    PP_sigRMN::frameToFix(&this->super_PP_sigRMN,local_158);
  }
  C_matrix<double>::operator=(&local_2c0,(C_matrix<double> *)&dt,&(this->super_PP_sigRMN).MU);
  C_matrix<double>::~C_matrix(&local_2c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&n,"spinEchoTime.txt",&local_2e1);
  C_matrix<double>::save(&(this->super_PP_sigRMN).T,(string *)&n);
  std::__cxx11::string::~string((string *)&n);
  std::allocator<char>::~allocator(&local_2e1);
  (this->super_PP_sigRMN).Bz0 = tmpBxy;
  (this->super_PP_sigRMN).Bxy = tempMuz0;
  (this->super_PP_sigRMN).omega = (this->super_PP_sigRMN).gamma * (this->super_PP_sigRMN).Bz0;
  (this->super_PP_sigRMN).muz0 = dw;
  for (local_2e8 = 0; local_2e8 < N; local_2e8 = local_2e8 + 1) {
    local_158 = 0.0;
    dVar2 = (this->super_PP_sigRMN).DW;
    tmpX = ((dVar2 + dVar2) * (double)local_2e8) / (double)(N + -1) - dVar2;
    (this->super_PP_sigRMN).muz0 = dw * (tmpX / ((this->super_PP_sigRMN).gamma * tmpBxy) + 1.0);
    (this->super_PP_sigRMN).Bz0 = tmpBxy + tmpX / (this->super_PP_sigRMN).gamma;
    (this->super_PP_sigRMN).Bxy = 0.0;
    (this->super_PP_sigRMN).omega = 0.0;
    (this->super_PP_sigRMN).sigLength = 200;
    tmpBz0 = t00 / (double)(this->super_PP_sigRMN).sigLength;
    t0 = mz0;
    tmpZ = my0;
    tmpY = mx0;
    dVar2 = PP_sigRMN::generateFIDsignalWithDiffusion
                      (&this->super_PP_sigRMN,mx0,my0,mz0,tmpBz0,tmpX);
    local_158 = local_158 + dVar2;
    pdVar1 = C_matrix<double>::operator()
                       (&(this->super_PP_sigRMN).MU,(this->super_PP_sigRMN).MU.endL,0);
    tmpY = *pdVar1;
    pdVar1 = C_matrix<double>::operator()
                       (&(this->super_PP_sigRMN).MU,(this->super_PP_sigRMN).MU.endL,1);
    tmpZ = *pdVar1;
    pdVar1 = C_matrix<double>::operator()
                       (&(this->super_PP_sigRMN).MU,(this->super_PP_sigRMN).MU.endL,2);
    t0 = *pdVar1;
    if (!rotFrame) {
      PP_sigRMN::frameToFix(&this->super_PP_sigRMN,local_158);
    }
    C_matrix<double>::operator+
              (&local_338,&(this->super_PP_sigRMN).MU,(C_matrix<double> *)&MUfisrtPulse1.m_A);
    C_matrix<double>::operator=(&local_310,(C_matrix<double> *)&MUfisrtPulse1.m_A,&local_338);
    C_matrix<double>::~C_matrix(&local_310);
    C_matrix<double>::~C_matrix(&local_338);
    (this->super_PP_sigRMN).Bz0 = tmpBxy + tmpX / (this->super_PP_sigRMN).gamma;
    (this->super_PP_sigRMN).Bxy = tempMuz0;
    (this->super_PP_sigRMN).omega = (this->super_PP_sigRMN).gamma * (this->super_PP_sigRMN).Bz0;
    (this->super_PP_sigRMN).sigLength = 4000;
    tmpBz0 = (this->super_PP_sigRMN).tw / (double)(this->super_PP_sigRMN).sigLength;
    dVar2 = PP_sigRMN::generateRMNsignal(&this->super_PP_sigRMN,tmpY,tmpZ,t0,tmpBz0,tmpX);
    local_158 = local_158 + dVar2;
    pdVar1 = C_matrix<double>::operator()
                       (&(this->super_PP_sigRMN).MU,(this->super_PP_sigRMN).MU.endL,0);
    tmpY = *pdVar1;
    pdVar1 = C_matrix<double>::operator()
                       (&(this->super_PP_sigRMN).MU,(this->super_PP_sigRMN).MU.endL,1);
    tmpZ = *pdVar1;
    pdVar1 = C_matrix<double>::operator()
                       (&(this->super_PP_sigRMN).MU,(this->super_PP_sigRMN).MU.endL,2);
    t0 = *pdVar1;
    if (!rotFrame) {
      PP_sigRMN::frameToFix(&this->super_PP_sigRMN,local_158);
    }
    C_matrix<double>::operator+(&local_388,&(this->super_PP_sigRMN).MU,(C_matrix<double> *)local_80)
    ;
    C_matrix<double>::operator=(&local_360,(C_matrix<double> *)local_80,&local_388);
    C_matrix<double>::~C_matrix(&local_360);
    C_matrix<double>::~C_matrix(&local_388);
    (this->super_PP_sigRMN).Bz0 = tmpBxy + tmpX / (this->super_PP_sigRMN).gamma;
    (this->super_PP_sigRMN).Bxy = 0.0;
    (this->super_PP_sigRMN).omega = 0.0;
    (this->super_PP_sigRMN).sigLength = 4000;
    tmpBz0 = ((this->super_PP_sigRMN).TE * 0.5 - (this->super_PP_sigRMN).tw) /
             (double)(this->super_PP_sigRMN).sigLength;
    dVar2 = PP_sigRMN::generateFIDsignalWithDiffusion
                      (&this->super_PP_sigRMN,tmpY,tmpZ,t0,tmpBz0,tmpX);
    local_158 = local_158 + dVar2;
    pdVar1 = C_matrix<double>::operator()
                       (&(this->super_PP_sigRMN).MU,(this->super_PP_sigRMN).MU.endL,0);
    tmpY = *pdVar1;
    pdVar1 = C_matrix<double>::operator()
                       (&(this->super_PP_sigRMN).MU,(this->super_PP_sigRMN).MU.endL,1);
    tmpZ = *pdVar1;
    pdVar1 = C_matrix<double>::operator()
                       (&(this->super_PP_sigRMN).MU,(this->super_PP_sigRMN).MU.endL,2);
    t0 = *pdVar1;
    if (!rotFrame) {
      PP_sigRMN::frameToFix(&this->super_PP_sigRMN,local_158);
    }
    C_matrix<double>::operator+
              (&local_3d8,&(this->super_PP_sigRMN).MU,(C_matrix<double> *)&MUsecondPulse1.m_A);
    C_matrix<double>::operator=(&local_3b0,(C_matrix<double> *)&MUsecondPulse1.m_A,&local_3d8);
    C_matrix<double>::~C_matrix(&local_3b0);
    C_matrix<double>::~C_matrix(&local_3d8);
    (this->super_PP_sigRMN).Bz0 = tmpBxy + tmpX / (this->super_PP_sigRMN).gamma;
    (this->super_PP_sigRMN).Bxy = tempMuz0;
    (this->super_PP_sigRMN).omega = (this->super_PP_sigRMN).gamma * (this->super_PP_sigRMN).Bz0;
    (this->super_PP_sigRMN).sigLength = 4000;
    tmpBz0 = (this->super_PP_sigRMN).tw / (double)(this->super_PP_sigRMN).sigLength;
    dVar2 = PP_sigRMN::generateRMNsignal(&this->super_PP_sigRMN,tmpY,tmpZ,t0,tmpBz0,tmpX);
    local_158 = local_158 + dVar2;
    pdVar1 = C_matrix<double>::operator()
                       (&(this->super_PP_sigRMN).MU,(this->super_PP_sigRMN).MU.endL,0);
    tmpY = *pdVar1;
    pdVar1 = C_matrix<double>::operator()
                       (&(this->super_PP_sigRMN).MU,(this->super_PP_sigRMN).MU.endL,1);
    tmpZ = *pdVar1;
    pdVar1 = C_matrix<double>::operator()
                       (&(this->super_PP_sigRMN).MU,(this->super_PP_sigRMN).MU.endL,2);
    t0 = *pdVar1;
    if (!rotFrame) {
      PP_sigRMN::frameToFix(&this->super_PP_sigRMN,local_158);
    }
    C_matrix<double>::operator+
              (&local_428,&(this->super_PP_sigRMN).MU,(C_matrix<double> *)&MUsecondFID1.m_A);
    C_matrix<double>::operator=(&local_400,(C_matrix<double> *)&MUsecondFID1.m_A,&local_428);
    C_matrix<double>::~C_matrix(&local_400);
    C_matrix<double>::~C_matrix(&local_428);
    (this->super_PP_sigRMN).Bz0 = tmpBxy + tmpX / (this->super_PP_sigRMN).gamma;
    (this->super_PP_sigRMN).Bxy = 0.0;
    (this->super_PP_sigRMN).omega = 0.0;
    (this->super_PP_sigRMN).sigLength = 4000;
    tmpBz0 = (((this->super_PP_sigRMN).TE - (this->super_PP_sigRMN).tw) * 1.5) /
             (double)(this->super_PP_sigRMN).sigLength;
    dVar2 = PP_sigRMN::generateFIDsignalWithDiffusion
                      (&this->super_PP_sigRMN,tmpY,tmpZ,t0,tmpBz0,tmpX);
    local_158 = dVar2 + local_158;
    if (!rotFrame) {
      PP_sigRMN::frameToFix(&this->super_PP_sigRMN,local_158);
    }
    C_matrix<double>::operator+(&local_478,&(this->super_PP_sigRMN).MU,(C_matrix<double> *)&dt);
    C_matrix<double>::operator=(&local_450,(C_matrix<double> *)&dt,&local_478);
    C_matrix<double>::~C_matrix(&local_450);
    C_matrix<double>::~C_matrix(&local_478);
    (this->super_PP_sigRMN).Bz0 = tmpBxy;
    (this->super_PP_sigRMN).Bxy = tempMuz0;
    (this->super_PP_sigRMN).omega = (this->super_PP_sigRMN).gamma * (this->super_PP_sigRMN).Bz0;
    (this->super_PP_sigRMN).muz0 = dw;
  }
  local_4d0 = 1.0 / (double)(N + 1);
  t0 = mz0;
  tmpZ = my0;
  tmpY = mx0;
  C_matrix<double>::operator*(&local_4c8,(C_matrix<double> *)&MUfisrtPulse1.m_A,&local_4d0);
  C_matrix<double>::operator=(&local_4a0,(C_matrix<double> *)&MUfisrtPulse1.m_A,&local_4c8);
  C_matrix<double>::~C_matrix(&local_4a0);
  C_matrix<double>::~C_matrix(&local_4c8);
  local_528 = 1.0 / (double)(N + 1);
  C_matrix<double>::operator*(&local_520,(C_matrix<double> *)local_80,&local_528);
  C_matrix<double>::operator=(&local_4f8,(C_matrix<double> *)local_80,&local_520);
  C_matrix<double>::~C_matrix(&local_4f8);
  C_matrix<double>::~C_matrix(&local_520);
  local_580 = 1.0 / (double)(N + 1);
  C_matrix<double>::operator*(&local_578,(C_matrix<double> *)&MUsecondPulse1.m_A,&local_580);
  C_matrix<double>::operator=(&local_550,(C_matrix<double> *)&MUsecondPulse1.m_A,&local_578);
  C_matrix<double>::~C_matrix(&local_550);
  C_matrix<double>::~C_matrix(&local_578);
  local_5d8 = 1.0 / (double)(N + 1);
  C_matrix<double>::operator*(&local_5d0,(C_matrix<double> *)&MUsecondFID1.m_A,&local_5d8);
  C_matrix<double>::operator=(&local_5a8,(C_matrix<double> *)&MUsecondFID1.m_A,&local_5d0);
  C_matrix<double>::~C_matrix(&local_5a8);
  C_matrix<double>::~C_matrix(&local_5d0);
  local_630 = 1.0 / (double)(N + 1);
  C_matrix<double>::operator*(&local_628,(C_matrix<double> *)&dt,&local_630);
  C_matrix<double>::operator=(&local_600,(C_matrix<double> *)&dt,&local_628);
  C_matrix<double>::~C_matrix(&local_600);
  C_matrix<double>::~C_matrix(&local_628);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_650,"initSig.txt",&local_651);
  C_matrix<double>::save((C_matrix<double> *)&MUfisrtPulse1.m_A,&local_650);
  std::__cxx11::string::~string((string *)&local_650);
  std::allocator<char>::~allocator(&local_651);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_678,"p90.txt",&local_679);
  C_matrix<double>::save((C_matrix<double> *)local_80,&local_678);
  std::__cxx11::string::~string((string *)&local_678);
  std::allocator<char>::~allocator(&local_679);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6a0,"fid.txt",&local_6a1);
  C_matrix<double>::save((C_matrix<double> *)&MUsecondPulse1.m_A,&local_6a0);
  std::__cxx11::string::~string((string *)&local_6a0);
  std::allocator<char>::~allocator(&local_6a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6c8,"p180.txt",&local_6c9);
  C_matrix<double>::save((C_matrix<double> *)&MUsecondFID1.m_A,&local_6c8);
  std::__cxx11::string::~string((string *)&local_6c8);
  std::allocator<char>::~allocator(&local_6c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6f0,"spinEcho.txt",&local_6f1)
  ;
  C_matrix<double>::save((C_matrix<double> *)&dt,&local_6f0);
  std::__cxx11::string::~string((string *)&local_6f0);
  std::allocator<char>::~allocator(&local_6f1);
  C_matrix<double>::~C_matrix((C_matrix<double> *)&dt);
  C_matrix<double>::~C_matrix((C_matrix<double> *)&MUsecondFID1.m_A);
  C_matrix<double>::~C_matrix((C_matrix<double> *)&MUsecondPulse1.m_A);
  C_matrix<double>::~C_matrix((C_matrix<double> *)local_80);
  C_matrix<double>::~C_matrix((C_matrix<double> *)&MUfisrtPulse1.m_A);
  return;
}

Assistant:

void PP_el_hahn::multiChromeDiffusion(double mx0, double my0, double mz0, int N, bool rotFrame)
{
    C_matrix<double> MUsteady1;
    C_matrix<double> MUfisrtPulse1;
    C_matrix<double> MUfirstFID1;
    C_matrix<double> MUsecondPulse1;
    C_matrix<double> MUsecondFID1;
    //the perturbating magnetic field pulsation is gamma*Bz0, but the actual constant field is Bz0+(dw/gamma)
    double dt;
    double tmpBz0 = Bz0;
    double tmpBxy = Bxy;
    double tempMuz0=muz0;
    double dw=0.0;
    double tmpX=mx0, tmpY=my0, tmpZ=mz0;

    muz0 = tempMuz0*(1.0+(dw/(gamma*tmpBz0)));
    //std::cout << 1.0+(dw/(gamma*tmpBz0)) << " " << tempMuz0 << " " << muz0 << std::endl;

    /*****************************************************************/
    /** We first consider the simulation with a slightly larger field*/
    /******************************************************/
    /** initialization */
    //apply the constant magnetic field during t0
    Bz0=tmpBz0+(dw/gamma);
    Bxy=0.0; omega=0;
    double t0=MAX(T1,T2);
    sigLength=200;
    dt=t0/((double) sigLength);
    double t00=0.0;

    //suppose that the magnetic momentum at rest is null
    t00+=generateFIDsignalWithDiffusion(tmpX, tmpY, tmpZ, dt, dw);
    tmpX=MU(MU.endL,0); tmpY=MU(MU.endL,1); tmpZ=MU(MU.endL,2);
    if(!rotFrame) frameToFix(t00);
    MUsteady1=MU;

    T.save("initSigTime.txt");


    /******************************************************/
    /** first pulse */
    //play one pi/2-pulse
    Bz0=tmpBz0+(dw/gamma);
    Bxy=tmpBxy; omega=gamma*Bz0;
    sigLength=4000;
    dt=tw/((double) sigLength);

    //suppose that the magnetic momentum at rest is null
    t00+=generateRMNsignal(tmpX, tmpY, tmpZ, dt, dw);
    tmpX=MU(MU.endL,0); tmpY=MU(MU.endL,1); tmpZ=MU(MU.endL,2);
    if(!rotFrame) frameToFix(t00);
    MUfisrtPulse1=MU;

    T.save("p90Time.txt");


    /******************************************************/
    /** free induction decay */
    //stop the radiofrequence pulse until the next pulse
    Bz0=tmpBz0+(dw/gamma);
    Bxy=0.0; omega=0;
    sigLength=4000;
    dt=(0.5*TE - tw)/((double) sigLength);

    //suppose that the magnetic momentum at rest is null
    t00+=generateFIDsignalWithDiffusion(tmpX, tmpY, tmpZ, dt, dw);
    tmpX=MU(MU.endL,0); tmpY=MU(MU.endL,1); tmpZ=MU(MU.endL,2);
    if(!rotFrame) frameToFix(t00);
    MUfirstFID1=MU;

    T.save("fidTime.txt");



    /******************************************************/
    /** second pulse */
    //play the pi-pulse
    Bz0=tmpBz0+(dw/gamma);
    Bxy=tmpBxy; omega=gamma*Bz0;
    sigLength=4000;
    dt=tw/((double) sigLength);

    //suppose that the magnetic momentum at rest is null
    t00+=generateRMNsignal(tmpX, tmpY, tmpZ, dt, dw);
    tmpX=MU(MU.endL,0); tmpY=MU(MU.endL,1); tmpZ=MU(MU.endL,2);
    if(!rotFrame) frameToFix(t00);
    MUsecondPulse1=MU;

    T.save("p180Time.txt");


    /******************************************************/
    /** spin echo */
    //stop the radiofrequence pulse until the next pulse
    Bz0=tmpBz0+(dw/gamma);
    Bxy=0.0; omega=0;
    sigLength=4000;
    dt=1.5*(TE-tw)/((double) sigLength);

    //suppose that the magnetic momentum at rest is null
    t00+=generateFIDsignalWithDiffusion(tmpX, tmpY, tmpZ, dt, dw);
    if(!rotFrame) frameToFix(t00);
    MUsecondFID1=MU;

    T.save("spinEchoTime.txt");

    //restore parameters
    Bz0=tmpBz0;
    Bxy=tmpBxy; omega=gamma*Bz0;
    muz0=tempMuz0;
    tmpX=mx0; tmpY=my0; tmpZ=mz0;



    for(int n=0 ; n<N ; n++)
    {
        t00=0.0;
        dw=-DW+2.0*DW*((double) n)/((double) (N-1));//
        //dw=2.0*DW*((((double) rand())/((double) RAND_MAX))-0.5);
        muz0 = tempMuz0*(1.0+(dw/(gamma*tmpBz0)));

        /*****************************************************************/
        /** We first consider the simulation with a slightly larger field*/
        /******************************************************/
        /** initialization */
        //apply the constant magnetic field during t0
        Bz0=tmpBz0+(dw/gamma);
        Bxy=0.0; omega=0;
        sigLength=200;
        dt=t0/((double) sigLength);

        //suppose that the magnetic momentum at rest is null
        t00+=generateFIDsignalWithDiffusion(tmpX, tmpY, tmpZ, dt, dw);
        tmpX=MU(MU.endL,0); tmpY=MU(MU.endL,1); tmpZ=MU(MU.endL,2);
        if(!rotFrame) frameToFix(t00);
        MUsteady1=(MU+MUsteady1);
        //std::cout << t00 << std::endl;


        /******************************************************/
        /** first pulse */
        //play one pi/2-pulse
        Bz0=tmpBz0+(dw/gamma);
        Bxy=tmpBxy; omega=gamma*Bz0;
        sigLength=4000;
        dt=tw/((double) sigLength);

        //suppose that the magnetic momentum at rest is null
        t00+=generateRMNsignal(tmpX, tmpY, tmpZ, dt, dw);
        tmpX=MU(MU.endL,0); tmpY=MU(MU.endL,1); tmpZ=MU(MU.endL,2);
        if(!rotFrame) frameToFix(t00);
        MUfisrtPulse1=(MU+MUfisrtPulse1);
        //std::cout << t00 << std::endl;


        /******************************************************/
        /** free induction decay */
        //stop the radiofrequence pulse until the next pulse
        Bz0=tmpBz0+(dw/gamma);
        Bxy=0.0; omega=0;
        sigLength=4000;
        dt=(0.5*TE - tw)/((double) sigLength);

        //suppose that the magnetic momentum at rest is null
        t00+=generateFIDsignalWithDiffusion(tmpX, tmpY, tmpZ, dt, dw);
        tmpX=MU(MU.endL,0); tmpY=MU(MU.endL,1); tmpZ=MU(MU.endL,2);
        if(!rotFrame) frameToFix(t00);
        MUfirstFID1=(MU+MUfirstFID1);



        /******************************************************/
        /** second pulse */
        //play the pi-pulse
        Bz0=tmpBz0+(dw/gamma);
        Bxy=tmpBxy; omega=gamma*Bz0;
        sigLength=4000;
        dt=tw/((double) sigLength);//2.0*

        //suppose that the magnetic momentum at rest is null
        t00+=generateRMNsignal(tmpX, tmpY, tmpZ, dt, dw);
        tmpX=MU(MU.endL,0); tmpY=MU(MU.endL,1); tmpZ=MU(MU.endL,2);
        if(!rotFrame) frameToFix(t00);
        MUsecondPulse1=(MU+MUsecondPulse1);
        //std::cout << t00 << std::endl;


        /******************************************************/
        /** spin echo */
        //stop the radiofrequence pulse until the next pulse
        Bz0=tmpBz0+(dw/gamma);
        Bxy=0.0; omega=0;
        sigLength=4000;
        dt=1.5*(TE-tw)/((double) sigLength);

        //suppose that the magnetic momentum at rest is null
        t00+=generateFIDsignalWithDiffusion(tmpX, tmpY, tmpZ, dt, dw);
        if(!rotFrame) frameToFix(t00);
        MUsecondFID1=(MU+MUsecondFID1);

        //restore the parameters
        Bz0=tmpBz0;
        Bxy=tmpBxy; omega=gamma*Bz0;
        muz0=tempMuz0;
        tmpX=mx0; tmpY=my0; tmpZ=mz0;
    }

    MUsteady1=MUsteady1*(1.0/((double) (N+1)));
    MUfisrtPulse1=MUfisrtPulse1*(1.0/((double) (N+1)));
    MUfirstFID1=MUfirstFID1*(1.0/((double) (N+1)));
    MUsecondPulse1=MUsecondPulse1*(1.0/((double) (N+1)));
    MUsecondFID1=MUsecondFID1*(1.0/((double) (N+1)));
    MUsteady1.save("initSig.txt");
    MUfisrtPulse1.save("p90.txt");
    MUfirstFID1.save("fid.txt");
    MUsecondPulse1.save("p180.txt");
    MUsecondFID1.save("spinEcho.txt");
    return;
}